

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBufferTest.cpp
# Opt level: O2

void __thiscall CircBufTest::test6(CircBufTest *this)

{
  long lVar1;
  anon_struct_129_2_522d0828 buf_t2;
  CircularBuffer t2Buf;
  CircularBuffer t1Buf;
  anon_struct_255_2_a6799241 buf_t1;
  uchar local_351 [129];
  CircularBuffer local_2d0 [224];
  CircularBuffer local_1f0 [225];
  uchar local_10f [255];
  
  for (lVar1 = 0; lVar1 != 0xfe; lVar1 = lVar1 + 1) {
    local_10f[lVar1] = 0xff;
  }
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 1) {
    local_351[lVar1] = 0xff;
  }
  local_10f[0xfe] = -1;
  local_351[0x80] = -1;
  JetHead::CircularBuffer::CircularBuffer(local_1f0,local_10f,0xfe);
  JetHead::CircularBuffer::CircularBuffer((CircularBuffer *)(local_351 + 0x81),local_351,0x80);
  test1(this,local_1f0);
  if (local_10f[0xfe] != -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x388,"Wrapped circular buffer has one past the end problem");
  }
  test2(this,(CircularBuffer *)(local_351 + 0x81));
  if (local_351[0x80] != -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/CircularBufferTest.cpp"
               ,0x38f,"Wrapped circular buffer has one past the end problem");
  }
  JetHead::CircularBuffer::~CircularBuffer((CircularBuffer *)(local_351 + 0x81));
  JetHead::CircularBuffer::~CircularBuffer(local_1f0);
  return;
}

Assistant:

void CircBufTest::test6()
{

	// Use a struct so that you can set a watchpoint in gdb on overflow
	// to see when circbuf attempts to use a byte of memeory it wasn't
	// given.
	struct {
		uint8_t testBuf[HUGE_BUF_SIZE];
		uint8_t overflow;
	} buf_t1;
	
	struct {
		uint8_t testBuf[BUFFER_SIZE];
		uint8_t overflow;
	} buf_t2 ;

	fill(buf_t1.testBuf, buf_t1.testBuf + HUGE_BUF_SIZE, -1);
	fill(buf_t2.testBuf, buf_t2.testBuf + BUFFER_SIZE, -1);
	
	buf_t1.overflow = (uint8_t)-1;
	buf_t2.overflow = (uint8_t)-1;
	
	CircularBuffer t1Buf(buf_t1.testBuf, HUGE_BUF_SIZE);
	CircularBuffer t2Buf(buf_t2.testBuf, BUFFER_SIZE);
	
	// Try test 1 again and check overflow
	test1(&t1Buf);
	if (buf_t1.overflow != (uint8_t)-1)
	{
		TestFailed("Wrapped circular buffer has one past the end problem");
	}
	
	test2(&t2Buf);

	if( buf_t2.overflow != (uint8_t)-1)
	{
		TestFailed("Wrapped circular buffer has one past the end problem");
	}
}